

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

uint64_t modinv2p64(uint64_t x)

{
  ulong in_RDI;
  uint64_t w;
  int l;
  uint64_t local_18;
  int local_c;
  
  local_18 = 1;
  if ((in_RDI & 1) == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x2e5,"test condition failed: x & 1");
    abort();
  }
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    local_18 = (2 - local_18 * in_RDI) * local_18;
  }
  return local_18;
}

Assistant:

static uint64_t modinv2p64(uint64_t x) {
    /* If w = 1/x mod 2^(2^L), then w*(2 - w*x) = 1/x mod 2^(2^(L+1)). See
     * Hacker's Delight second edition, Henry S. Warren, Jr., pages 245-247 for
     * why. Start with L=0, for which it is true for every odd x that
     * 1/x=1 mod 2. Iterating 6 times gives us 1/x mod 2^64. */
    int l;
    uint64_t w = 1;
    CHECK(x & 1);
    for (l = 0; l < 6; ++l) w *= (2 - w*x);
    return w;
}